

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall helics::Input::loadSourceInformation(Input *this)

{
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  string_view typeName;
  string_view typeName_00;
  string_view typeName_01;
  bool bVar1;
  undefined1 uVar2;
  DataType DVar3;
  const_reference pvVar4;
  precise_unit *ppVar5;
  char *in_RDI;
  precise_unit pVar6;
  pair<helics::DataType,_std::shared_ptr<units::precise_unit>_> *src;
  iterator __end5;
  iterator __begin5;
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  *__range5;
  shared_ptr<units::precise_unit> U;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *res_1;
  iterator __end4;
  iterator __begin4;
  json *__range4;
  int ii;
  json iValue_1;
  json iValue;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *res;
  iterator __end3;
  iterator __begin3;
  json *__range3;
  json jvalue;
  string *iUnits;
  string *iType;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffca8;
  Interface *in_stack_fffffffffffffcb0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffcb8;
  precise_unit *in_stack_fffffffffffffcc0;
  value_type *in_stack_fffffffffffffcd0;
  precise_unit *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  size_type in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  DataType in_stack_fffffffffffffd2c;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  __normal_iterator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_*,_std::vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>_>
  local_260;
  char *local_258;
  precise_unit local_230;
  precise_unit local_1f0;
  reference local_1b0;
  undefined1 *local_168;
  int local_15c;
  __sv_type local_158;
  undefined1 local_148 [16];
  undefined8 local_138;
  __sv_type local_118;
  undefined8 local_f8;
  __sv_type local_d0;
  DataType local_bc;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *local_b8;
  undefined1 *local_60;
  __sv_type local_58;
  undefined1 local_48 [16];
  __sv_type local_38;
  string *local_28;
  string *local_20;
  __sv_type local_18;
  
  if (*(int *)(in_RDI + 0x50) == -1) {
    Interface::getExtractionType_abi_cxx11_(in_stack_fffffffffffffcb0);
    local_18 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcb0);
    typeName._M_len._7_1_ = in_stack_fffffffffffffd47;
    typeName._M_len._0_7_ = in_stack_fffffffffffffd40;
    typeName._M_str = in_RDI;
    DVar3 = getTypeFromString(typeName);
    *(DataType *)(in_RDI + 0x50) = DVar3;
  }
  in_RDI[0x5c] = '\0';
  local_20 = Interface::getInjectionType_abi_cxx11_(in_stack_fffffffffffffcb0);
  local_28 = Interface::getInjectionUnits_abi_cxx11_(in_stack_fffffffffffffcb0);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffcb0);
  typeName_00._M_len._7_1_ = in_stack_fffffffffffffd47;
  typeName_00._M_len._0_7_ = in_stack_fffffffffffffd40;
  typeName_00._M_str = in_RDI;
  DVar3 = getTypeFromString(typeName_00);
  *(DataType *)(in_RDI + 0x54) = DVar3;
  if ((*(int *)(in_RDI + 0x54) == 0x21) ||
     ((bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x389e5c
                      ), !bVar1 &&
      (pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffcb0), *pvVar4 == '[')))) {
    std::
    vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
    ::clear((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
             *)0x389e91);
    if (*(int *)(in_RDI + 0x54) == 0x21) {
      local_58 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffcb0);
      jsonString._M_str._0_4_ = in_stack_fffffffffffffd28;
      jsonString._M_len = in_stack_fffffffffffffd20;
      jsonString._M_str._4_4_ = in_stack_fffffffffffffd2c;
      fileops::loadJsonStr_abi_cxx11_(jsonString);
      local_60 = local_48;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::begin(in_stack_fffffffffffffcb8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::end(in_stack_fffffffffffffcb8);
      while (uVar2 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8), (bool)uVar2
            ) {
        in_stack_fffffffffffffd38 =
             (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              *)nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*(in_stack_fffffffffffffd38);
        local_b8 = in_stack_fffffffffffffd38;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffcb8);
        local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffcb0);
        typeName_01._M_len._7_1_ = uVar2;
        typeName_01._M_len._0_7_ = in_stack_fffffffffffffd40;
        typeName_01._M_str = in_RDI;
        in_stack_fffffffffffffd2c = getTypeFromString(typeName_01);
        local_f8 = 0;
        local_bc = in_stack_fffffffffffffd2c;
        std::
        vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
        ::emplace_back<helics::DataType,decltype(nullptr)>
                  ((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                    *)in_stack_fffffffffffffcc0,(DataType *)in_stack_fffffffffffffcb8,
                   &in_stack_fffffffffffffcb0->_vptr_Interface);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcb0);
        nlohmann::json_abi_v3_11_3::detail::
        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
        ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)in_stack_fffffffffffffcb0);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffcb0);
    }
    else {
      local_118 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffcb0);
      jsonString_00._M_str._0_4_ = in_stack_fffffffffffffd28;
      jsonString_00._M_len = in_stack_fffffffffffffd20;
      jsonString_00._M_str._4_4_ = in_stack_fffffffffffffd2c;
      fileops::loadJsonStr_abi_cxx11_(jsonString_00);
      in_stack_fffffffffffffd20 =
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::size(in_stack_fffffffffffffcb8);
      local_138 = 0;
      std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>::
      pair<helics::DataType_&,_std::nullptr_t,_true>
                ((pair<helics::DataType,_std::shared_ptr<units::precise_unit>_> *)
                 in_stack_fffffffffffffcb0,(DataType *)in_stack_fffffffffffffca8,(void **)0x38a119);
      std::
      vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
      ::resize((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               (size_type)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>::~pair
                ((pair<helics::DataType,_std::shared_ptr<units::precise_unit>_> *)0x38a141);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffcb0);
    }
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38a1a6);
    if (!bVar1) {
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcb0);
      if (*pvVar4 == '[') {
        in_RDI[0x5c] = '\x01';
        local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffcb0);
        jsonString_01._M_str._0_4_ = in_stack_fffffffffffffd28;
        jsonString_01._M_len = in_stack_fffffffffffffd20;
        jsonString_01._M_str._4_4_ = in_stack_fffffffffffffd2c;
        fileops::loadJsonStr_abi_cxx11_(jsonString_01);
        local_15c = 0;
        local_168 = local_148;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::begin(in_stack_fffffffffffffcb8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::end(in_stack_fffffffffffffcb8);
        pVar6._8_8_ = in_stack_fffffffffffffce8;
        pVar6.multiplier_ = (double)in_stack_fffffffffffffcf0;
        while( true ) {
          bVar1 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          if (!bVar1) break;
          local_1b0 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::operator*(in_stack_fffffffffffffd38);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffcb8);
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x38a2bf);
          if (!bVar1) {
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pVar6.multiplier_,pVar6._8_8_);
            ::units::getDefaultFlags();
            pVar6 = ::units::unit_from_string((string *)pVar6.multiplier_,pVar6._8_8_);
            local_1f0 = pVar6;
            std::make_shared<units::precise_unit,units::precise_unit>(in_stack_fffffffffffffcd8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcb0);
            std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffcb0);
            bVar1 = ::units::is_valid(in_stack_fffffffffffffcc0);
            if (bVar1) {
              std::
              vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
              ::operator[]((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                            *)(in_RDI + 0xc0),(long)local_15c);
              std::shared_ptr<units::precise_unit>::operator=
                        ((shared_ptr<units::precise_unit> *)in_stack_fffffffffffffcb0,
                         (shared_ptr<units::precise_unit> *)in_stack_fffffffffffffca8);
            }
            std::shared_ptr<units::precise_unit>::~shared_ptr
                      ((shared_ptr<units::precise_unit> *)0x38a428);
          }
          local_15c = local_15c + 1;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcb0);
          nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)in_stack_fffffffffffffcb0);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffcb0);
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        ppVar5 = (precise_unit *)::units::getDefaultFlags();
        local_230 = ::units::unit_from_string
                              (in_stack_fffffffffffffcf0,(uint64_t)in_stack_fffffffffffffce8);
        std::make_shared<units::precise_unit,units::precise_unit>(ppVar5);
        std::shared_ptr<units::precise_unit>::operator=
                  ((shared_ptr<units::precise_unit> *)in_stack_fffffffffffffcb0,
                   (shared_ptr<units::precise_unit> *)in_stack_fffffffffffffca8);
        std::shared_ptr<units::precise_unit>::~shared_ptr
                  ((shared_ptr<units::precise_unit> *)0x38a529);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcb0);
        std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffcb0);
        bVar1 = ::units::is_valid(in_stack_fffffffffffffcc0);
        if (bVar1) {
          local_258 = in_RDI + 0xc0;
          local_260._M_current =
               (pair<helics::DataType,_std::shared_ptr<units::precise_unit>_> *)
               std::
               vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
               ::begin((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                        *)in_stack_fffffffffffffca8);
          std::
          vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
          ::end((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                 *)in_stack_fffffffffffffca8);
          while( true ) {
            bVar1 = __gnu_cxx::
                    operator==<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_*,_std::vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>_>
                              ((__normal_iterator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_*,_std::vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>_>
                                *)in_stack_fffffffffffffcb0,
                               (__normal_iterator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_*,_std::vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>_>
                                *)in_stack_fffffffffffffca8);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            __gnu_cxx::
            __normal_iterator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_*,_std::vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>_>
            ::operator*(&local_260);
            std::shared_ptr<units::precise_unit>::operator=
                      ((shared_ptr<units::precise_unit> *)in_stack_fffffffffffffcb0,
                       (shared_ptr<units::precise_unit> *)in_stack_fffffffffffffca8);
            __gnu_cxx::
            __normal_iterator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_*,_std::vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>_>
            ::operator++(&local_260);
          }
        }
        else {
          std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_fffffffffffffcc0);
        }
      }
    }
  }
  else {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38a64e);
    if (!bVar1) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      ppVar5 = (precise_unit *)::units::getDefaultFlags();
      pVar6 = ::units::unit_from_string
                        (in_stack_fffffffffffffcf0,(uint64_t)in_stack_fffffffffffffce8);
      std::make_shared<units::precise_unit,units::precise_unit>(in_stack_fffffffffffffcd8);
      std::shared_ptr<units::precise_unit>::operator=
                (pVar6._8_8_,(shared_ptr<units::precise_unit> *)in_stack_fffffffffffffca8);
      std::shared_ptr<units::precise_unit>::~shared_ptr((shared_ptr<units::precise_unit> *)0x38a6f2)
      ;
      std::__cxx11::string::~string(pVar6._8_8_);
      std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*(pVar6._8_8_);
      bVar1 = ::units::is_valid(ppVar5);
      if (!bVar1) {
        std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)ppVar5);
      }
    }
  }
  return;
}

Assistant:

void Input::loadSourceInformation()
{
    if (targetType == DataType::HELICS_UNKNOWN) {
        targetType = getTypeFromString(getExtractionType());
    }
    multiUnits = false;
    const auto& iType = getInjectionType();
    const auto& iUnits = getInjectionUnits();
    injectionType = getTypeFromString(iType);
    if ((injectionType == DataType::HELICS_MULTI) || (!iUnits.empty() && iUnits.front() == '[')) {
        sourceTypes.clear();
        if (injectionType == DataType::HELICS_MULTI) {
            auto jvalue = fileops::loadJsonStr(iType);
            for (auto& res : jvalue) {
                sourceTypes.emplace_back(getTypeFromString(res.get<std::string>()), nullptr);
            }
        } else {
            auto iValue = fileops::loadJsonStr(iUnits);
            sourceTypes.resize(iValue.size(), {injectionType, nullptr});
        }
        if (!iUnits.empty()) {
            if (iUnits.front() == '[') {
                multiUnits = true;
                auto iValue = fileops::loadJsonStr(iUnits);
                int ii{0};
                for (auto& res : iValue) {
                    auto str = res.get<std::string>();
                    if (!str.empty()) {
                        auto U =
                            std::make_shared<units::precise_unit>(units::unit_from_string(str));
                        if (units::is_valid(*U)) {
                            sourceTypes[ii].second = std::move(U);
                        }
                    }
                    ++ii;
                }
            } else {
                inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
                if (!units::is_valid(*inputUnits)) {
                    inputUnits.reset();
                } else {
                    for (auto& src : sourceTypes) {
                        src.second = inputUnits;
                    }
                }
            }
        }

    } else {
        if (!iUnits.empty()) {
            inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
            if (!units::is_valid(*inputUnits)) {
                inputUnits.reset();
            }
        }
    }
}